

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem.cpp
# Opt level: O0

void __thiscall r_exec::_Mem::inject(_Mem *this,View *view)

{
  bool bVar1;
  uint uVar2;
  Code *pCVar3;
  Group *host_00;
  ulong uVar4;
  uint64_t ijt_00;
  EInjectionJob *this_00;
  InjectionJob *this_01;
  uint64_t ijt;
  uint64_t now;
  Group *host;
  View *view_local;
  _Mem *this_local;
  
  pCVar3 = core::P<r_code::Code>::operator->(&(view->super_View).object);
  uVar2 = (*(pCVar3->super__Object)._vptr__Object[0xe])();
  if ((uVar2 & 1) == 0) {
    host_00 = View::get_host(view);
    uVar2 = (*(host_00->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.super_LObject.
              super_Code.super__Object._vptr__Object[0xe])();
    if ((uVar2 & 1) == 0) {
      uVar4 = (*Now)();
      ijt_00 = r_code::View::get_ijt(&view->super_View);
      pCVar3 = core::P<r_code::Code>::operator->(&(view->super_View).object);
      bVar1 = r_code::Code::is_registered(pCVar3);
      if (bVar1) {
        if (uVar4 < ijt_00) {
          this_00 = (EInjectionJob *)operator_new(0x28);
          EInjectionJob::EInjectionJob(this_00,view,ijt_00);
          pushTimeJob(this,(TimeJob *)this_00);
        }
        else {
          pCVar3 = core::P::operator_cast_to_Code_((P *)&(view->super_View).object);
          inject_existing_object(this,view,pCVar3,host_00);
        }
      }
      else if (uVar4 < ijt_00) {
        this_01 = (InjectionJob *)operator_new(0x28);
        InjectionJob::InjectionJob(this_01,view,ijt_00);
        pushTimeJob(this,(TimeJob *)this_01);
      }
      else {
        inject_new_object(this,view);
      }
    }
    else if (view != (View *)0x0) {
      (*(view->super_View).super__Object._vptr__Object[1])();
    }
  }
  else if (view != (View *)0x0) {
    (*(view->super_View).super__Object._vptr__Object[1])();
  }
  return;
}

Assistant:

void _Mem::inject(View *view)
{
    if (view->object->is_invalidated()) {
        delete view;
        return;
    }

    Group *host = view->get_host();

    if (host->is_invalidated()) {
        delete view;
        return;
    }

    uint64_t now = Now();
    uint64_t ijt = view->get_ijt();

    if (view->object->is_registered()) { // existing object.
        if (ijt <= now) {
            inject_existing_object(view, view->object, host);
        } else {
            pushTimeJob(new EInjectionJob(view, ijt));
        }
    } else { // new object.
        if (ijt <= now) {
            inject_new_object(view);
        } else {
            pushTimeJob(new InjectionJob(view, ijt));
        }
    }
}